

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.h
# Opt level: O0

void __thiscall libsgp4::Observer::Observer(Observer *this,CoordGeodetic *geo)

{
  DateTime local_20;
  CoordGeodetic *local_18;
  CoordGeodetic *geo_local;
  Observer *this_local;
  
  local_18 = geo;
  geo_local = &this->m_geo;
  CoordGeodetic::CoordGeodetic(&this->m_geo,geo);
  DateTime::DateTime(&local_20);
  Eci::Eci(&this->m_eci,&local_20,local_18);
  return;
}

Assistant:

explicit Observer(const CoordGeodetic &geo)
        : m_geo(geo)
        , m_eci(DateTime(), geo)
    {
    }